

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O2

int MipsCpuCaps(char *cpuinfo_name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  char cpuinfo_line [512];
  
  __stream = fopen64(cpuinfo_name,"r");
  if (__stream == (FILE *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      pcVar2 = fgets(cpuinfo_line,0x1ff,__stream);
      if (pcVar2 == (char *)0x0) goto LAB_00127304;
      iVar1 = bcmp(cpuinfo_line,"cpu model",9);
      if (iVar1 == 0) {
        pcVar2 = strstr(cpuinfo_line,"Loongson-3");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strstr(cpuinfo_line,"Loongson-2K");
          uVar4 = uVar3;
          if (pcVar2 != (char *)0x0) {
            uVar3 = 0xc00000;
            uVar4 = 0xc00000;
          }
        }
        else {
          uVar3 = uVar3 | 0x800000;
          uVar4 = uVar3;
        }
      }
      auVar6[0] = -(cpuinfo_line[0] == 'A');
      auVar6[1] = -(cpuinfo_line[1] == 'S');
      auVar6[2] = -(cpuinfo_line[2] == 'E');
      auVar6[3] = -(cpuinfo_line[3] == 's');
      auVar6[4] = -(cpuinfo_line[4] == ' ');
      auVar6[5] = -(cpuinfo_line[5] == 'i');
      auVar6[6] = -(cpuinfo_line[6] == 'm');
      auVar6[7] = -(cpuinfo_line[7] == 'p');
      auVar6[8] = -(cpuinfo_line[8] == 'l');
      auVar6[9] = -(cpuinfo_line[9] == 'e');
      auVar6[10] = -(cpuinfo_line[10] == 'm');
      auVar6[0xb] = -(cpuinfo_line[0xb] == 'e');
      auVar6[0xc] = -(cpuinfo_line[0xc] == 'n');
      auVar6[0xd] = -(cpuinfo_line[0xd] == 't');
      auVar6[0xe] = -(cpuinfo_line[0xe] == 'e');
      auVar6[0xf] = -(cpuinfo_line[0xf] == 'd');
    } while ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar6[0xf] >> 7) << 0xf) != 0xffff);
    pcVar2 = strstr(cpuinfo_line,"loongson-mmi");
    uVar5 = uVar3;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strstr(cpuinfo_line,"loongson-ext");
      uVar4 = uVar3;
      if (pcVar2 != (char *)0x0) {
        uVar5 = uVar3 | 0x800000;
        uVar4 = uVar3 | 0x800000;
      }
    }
    pcVar2 = strstr(cpuinfo_line,"msa");
    uVar3 = uVar4;
    if (pcVar2 != (char *)0x0) {
      uVar3 = uVar5 | 0x400000;
    }
LAB_00127304:
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

LIBYUV_API SAFEBUFFERS int MipsCpuCaps(const char* cpuinfo_name) {
  char cpuinfo_line[512];
  int flag = 0x0;
  FILE* f = fopen(cpuinfo_name, "r");
  if (!f) {
    // Assume nothing if /proc/cpuinfo is unavailable.
    // This will occur for Chrome sandbox for Pepper or Render process.
    return 0;
  }
  while (fgets(cpuinfo_line, sizeof(cpuinfo_line) - 1, f)) {
    if (memcmp(cpuinfo_line, "cpu model", 9) == 0) {
      // Workaround early kernel without mmi in ASEs line.
      if (strstr(cpuinfo_line, "Loongson-3")) {
        flag |= kCpuHasMMI;
      } else if (strstr(cpuinfo_line, "Loongson-2K")) {
        flag |= kCpuHasMMI | kCpuHasMSA;
      }
    }
    if (memcmp(cpuinfo_line, "ASEs implemented", 16) == 0) {
      if (strstr(cpuinfo_line, "loongson-mmi") &&
          strstr(cpuinfo_line, "loongson-ext")) {
        flag |= kCpuHasMMI;
      }
      if (strstr(cpuinfo_line, "msa")) {
        flag |= kCpuHasMSA;
      }
      // ASEs is the last line, so we can break here.
      break;
    }
  }
  fclose(f);
  return flag;
}